

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandPrintSupport(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *__ptr;
  char *pcVar3;
  uint fVerbose;
  uint fMatrix;
  char *pcVar4;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  bVar1 = true;
  fMatrix = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"svwh"), iVar2 == 0x77) {
      fMatrix = fMatrix ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    else {
      if (iVar2 != 0x73) {
        Abc_Print(-2,"usage: print_supp [-svwh]\n");
        Abc_Print(-2,"\t        prints the supports of the CO nodes\n");
        pcVar4 = "yes";
        pcVar3 = "yes";
        if (!bVar1) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-s    : toggle printing structural support only [default = %s].\n",pcVar3);
        pcVar3 = "yes";
        if (fVerbose == 0) {
          pcVar3 = "no";
        }
        Abc_Print(-2,"\t-v    : enable verbose output [default = %s].\n",pcVar3);
        if (fMatrix == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-w    : enable printing CI/CO dependency matrix [default = %s].\n",pcVar4);
        pcVar3 = "\t-h    : print the command usage\n";
        iVar2 = -2;
LAB_0024bc10:
        Abc_Print(iVar2,pcVar3);
        return 1;
      }
      bVar1 = (bool)(bVar1 ^ 1);
    }
  }
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar3 = "Empty network.\n";
  }
  else {
    if (bVar1) {
      Abc_NtkPrintStrSupports(pNtk,fMatrix);
      return 0;
    }
    if (pNtk->nObjCounts[8] == 0) {
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        __ptr = Sim_ComputeFunSupp(pNtk,fVerbose);
        if (*__ptr->pArray != (void *)0x0) {
          free(*__ptr->pArray);
          *__ptr->pArray = (void *)0x0;
        }
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        if (__ptr == (Vec_Ptr_t *)0x0) {
          return 0;
        }
        free(__ptr);
        return 0;
      }
      pcVar3 = "This command works only for AIGs (run \"strash\").\n";
    }
    else {
      pcVar3 = "This command works only for combinational networks (run \"comb\").\n";
    }
  }
  iVar2 = -1;
  goto LAB_0024bc10;
}

Assistant:

int Abc_CommandPrintSupport( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Vec_Ptr_t * vSuppFun;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fStruct;
    int fVerbose;
    int fVeryVerbose;
    extern Vec_Ptr_t * Sim_ComputeFunSupp( Abc_Ntk_t * pNtk, int fVerbose );
    extern void Abc_NtkPrintStrSupports( Abc_Ntk_t * pNtk, int fMatrix );

    // set defaults
    fStruct = 1;
    fVerbose = 0;
    fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "svwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fStruct ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    // print support information
    if ( fStruct )
    {
        Abc_NtkPrintStrSupports( pNtk, fVeryVerbose );
        return 0;
    }

    if ( !Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( -1, "This command works only for combinational networks (run \"comb\").\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    vSuppFun = Sim_ComputeFunSupp( pNtk, fVerbose );
    ABC_FREE( vSuppFun->pArray[0] );
    Vec_PtrFree( vSuppFun );
    return 0;

usage:
    Abc_Print( -2, "usage: print_supp [-svwh]\n" );
    Abc_Print( -2, "\t        prints the supports of the CO nodes\n" );
    Abc_Print( -2, "\t-s    : toggle printing structural support only [default = %s].\n", fStruct? "yes": "no" );
    Abc_Print( -2, "\t-v    : enable verbose output [default = %s].\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w    : enable printing CI/CO dependency matrix [default = %s].\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}